

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O3

string * hashStr_abi_cxx11_(string *__return_storage_ptr__,uint32_t param_1)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  long *plVar10;
  ulong uVar11;
  ulong *puVar12;
  string __str_1;
  string __str;
  long *local_f0;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  ulong *local_90;
  uint local_88;
  undefined4 uStack_84;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ulong *local_50;
  uint local_48;
  ulong local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n","");
  uVar8 = c._M_elems[1];
  uVar9 = c._M_elems[0];
  if (c._M_elems[0] == 0) {
    if (c._M_elems[1] == 0) goto LAB_00106813;
    cVar4 = '\x01';
    if (9 < c._M_elems[1]) {
      uVar9 = c._M_elems[1];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar9 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_001065a5;
        }
        if (uVar9 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_001065a5;
        }
        if (uVar9 < 10000) goto LAB_001065a5;
        bVar2 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_001065a5:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,(uint)local_a8,uVar8);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x11641a);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c0 = *plVar5;
      uStack_b8 = puVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*puVar6;
    }
    local_c8 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    local_40[0] = local_a0;
    puVar12 = local_b0;
    if (local_b0 == &local_a0) goto LAB_00106813;
  }
  else {
    cVar4 = '\x01';
    if (c._M_elems[1] == 0) {
      if (9 < c._M_elems[0]) {
        uVar8 = c._M_elems[0];
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar8 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_001066db;
          }
          if (uVar8 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_001066db;
          }
          if (uVar8 < 10000) goto LAB_001066db;
          bVar2 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar2);
        cVar4 = cVar4 + '\x01';
      }
LAB_001066db:
      local_b0 = &local_a0;
      std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,(uint)local_a8,uVar9);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x116408);
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_c0 = *plVar5;
        uStack_b8 = puVar6[3];
        local_d0 = &local_c0;
      }
      else {
        local_c0 = *plVar5;
        local_d0 = (long *)*puVar6;
      }
      local_c8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_e0 = *plVar7;
        lStack_d8 = plVar5[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar7;
        local_f0 = (long *)*plVar5;
      }
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      local_40[0] = local_a0;
      puVar12 = local_b0;
      if (local_b0 == &local_a0) goto LAB_00106813;
    }
    else {
      if (9 < c._M_elems[0]) {
        uVar8 = c._M_elems[0];
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar8 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_00106267;
          }
          if (uVar8 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_00106267;
          }
          if (uVar8 < 10000) goto LAB_00106267;
          bVar2 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar2);
        cVar4 = cVar4 + '\x01';
      }
LAB_00106267:
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar9);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1163ea);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar12 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar12) {
        local_a0 = *puVar12;
        lStack_98 = plVar5[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *puVar12;
        local_b0 = (ulong *)*plVar5;
      }
      local_a8 = plVar5[1];
      *plVar5 = (long)puVar12;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      uVar9 = c._M_elems[1];
      cVar4 = '\x01';
      if (9 < c._M_elems[1]) {
        uVar8 = c._M_elems[1];
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar8 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_001063b5;
          }
          if (uVar8 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_001063b5;
          }
          if (uVar8 < 10000) goto LAB_001063b5;
          bVar2 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar2);
        cVar4 = cVar4 + '\x01';
      }
LAB_001063b5:
      local_90 = local_80;
      std::__cxx11::string::_M_construct((ulong)&local_90,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_90,local_88,uVar9);
      uVar1 = CONCAT44(uStack_84,local_88) + local_a8;
      uVar11 = 0xf;
      if (local_b0 != &local_a0) {
        uVar11 = local_a0;
      }
      if (uVar11 < uVar1) {
        uVar11 = 0xf;
        if (local_90 != local_80) {
          uVar11 = local_80[0];
        }
        if (uVar11 < uVar1) goto LAB_00106429;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      }
      else {
LAB_00106429:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
      }
      local_d0 = &local_c0;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_c0 = *plVar5;
        uStack_b8 = puVar6[3];
      }
      else {
        local_c0 = *plVar5;
        local_d0 = (long *)*puVar6;
      }
      local_c8 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)plVar5 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_e0 = *plVar7;
        lStack_d8 = plVar5[3];
        local_f0 = &local_e0;
      }
      else {
        local_e0 = *plVar7;
        local_f0 = (long *)*plVar5;
      }
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,local_e0 + 1);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,local_c0 + 1);
      }
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      puVar12 = local_50;
      if (local_50 == local_40) goto LAB_00106813;
    }
  }
  operator_delete(puVar12,local_40[0] + 1);
LAB_00106813:
  uVar9 = c._M_elems[2];
  if (c._M_elems[2] != 0) {
    cVar4 = '\x01';
    if (9 < c._M_elems[2]) {
      uVar8 = c._M_elems[2];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0010686f;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0010686f;
        }
        if (uVar8 < 10000) goto LAB_0010686f;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_0010686f:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,(uint)local_a8,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x11642d);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c0 = *plVar5;
      uStack_b8 = puVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*puVar6;
    }
    local_c8 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
  }
  uVar9 = c._M_elems[3];
  if (c._M_elems[3] != 0) {
    cVar4 = '\x01';
    if (9 < c._M_elems[3]) {
      uVar8 = c._M_elems[3];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00106a03;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00106a03;
        }
        if (uVar8 < 10000) goto LAB_00106a03;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00106a03:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,(uint)local_a8,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x11641a);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c0 = *plVar5;
      uStack_b8 = puVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*puVar6;
    }
    local_c8 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
  }
  if (c._M_elems[4] != 0) {
    uVar9 = c._M_elems[4] + 1;
    cVar4 = '\x01';
    if (9 < uVar9) {
      uVar8 = uVar9;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00106b99;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00106b99;
        }
        if (uVar8 < 10000) goto LAB_00106b99;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00106b99:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,(uint)local_a8,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x116440);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c0 = *plVar5;
      uStack_b8 = puVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*puVar6;
    }
    local_c8 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar5[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f0);
    if (local_f0 != &local_e0) {
      operator_delete(local_f0,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
  }
  uVar9 = c._M_elems[5];
  if (c._M_elems[5] != 0) {
    cVar4 = '\x01';
    if (9 < c._M_elems[5]) {
      uVar8 = c._M_elems[5];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00106d2d;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00106d2d;
        }
        if (uVar8 < 10000) goto LAB_00106d2d;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00106d2d:
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct((ulong)&local_b0,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,(uint)local_a8,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x11641a);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c0 = *plVar5;
      uStack_b8 = puVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar5;
      local_d0 = (long *)*puVar6;
    }
    local_c8 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar5[3];
      plVar10 = &local_e0;
    }
    else {
      local_e0 = *plVar7;
      plVar10 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)plVar10);
    if (plVar10 != &local_e0) {
      operator_delete(plVar10,local_e0 + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(uint32_t){
    std::string str =
"    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n";
    if(c[0] && c[1])
        str += "        a =  (a ^ " + std::to_string(c[0]) + ") ^ (a >> " + std::to_string(c[1]) + ");\n";
    else if(c[0])
        str += "        a ^= a ^ " + std::to_string(c[0]) + ";\n";
    else if(c[1])
        str += "        a ^= a >> " + std::to_string(c[1]) + ";\n";

    if(c[2]) str += "        a += a << " + std::to_string(c[2]) + ";\n";
    if(c[3]) str += "        a ^= a >> " + std::to_string(c[3]) + ";\n";
    if(c[4]) str += "        a *= " + std::to_string(c[4]+1) + ";\n";
    if(c[5]) str += "        a ^= a >> " + std::to_string(c[5]) + ";\n";

    str += "        return a;\n"
           "    }\n";

    return str;
}